

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::FindImplicitRootObject
          (LargeHeapBlock *this,void *objectAddress,Recycler *recycler,
          RecyclerHeapObjectInfo *heapObject)

{
  bool bVar1;
  BOOL BVar2;
  LargeObjectHeader *local_30;
  LargeObjectHeader *pHeader;
  
  BVar2 = IsValidObject(this,objectAddress);
  if (BVar2 == 0) {
    bVar1 = false;
  }
  else {
    local_30 = (LargeObjectHeader *)0x0;
    bVar1 = GetObjectHeader(this,objectAddress,&local_30);
    if (bVar1) {
      heapObject->m_address = objectAddress;
      heapObject->m_recycler = recycler;
      heapObject->m_heapBlock = &this->super_HeapBlock;
      (heapObject->field_3).m_attributes = (byte *)local_30;
      heapObject->isUsingLargeHeapBlock = true;
    }
  }
  return bVar1;
}

Assistant:

bool
LargeHeapBlock::FindImplicitRootObject(void* objectAddress, Recycler * recycler, RecyclerHeapObjectInfo& heapObject)
{
    if (!IsValidObject(objectAddress))
    {
        return false;
    }

    LargeObjectHeader* pHeader = nullptr;

    if (!GetObjectHeader(objectAddress, &pHeader))
    {
        return false;
    }

#ifdef LARGEHEAPBLOCK_ENCODING
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, nullptr);
    heapObject.SetLargeHeapBlockHeader(pHeader);
#else
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, pHeader->GetAttributesPtr());
#endif
    return true;
}